

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O1

AlphaVector * __thiscall
AlphaVectorWeighted::BeliefBackup
          (AlphaVector *__return_storage_ptr__,AlphaVectorWeighted *this,JointBeliefInterface *b,
          Index a,GaoVectorSet *G,QFunctionsDiscrete *Q)

{
  double dVar1;
  undefined1 auVar2 [16];
  long lVar3;
  E *this_00;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<double,_std::allocator<double>_> valuesWeighted;
  AlphaVector alphaPOMDP;
  AlphaVector alphaBG;
  allocator_type local_a1;
  ValueFunctionPOMDPDiscrete local_a0;
  AlphaVector local_88;
  AlphaVector local_60;
  value_type_conflict3 local_38;
  
  if ((this->super_AlphaVectorPOMDP).field_0x20 == '\0') {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"AlphaVectorWeighted::BeliefBackup not initialized");
    __cxa_throw(this_00,&E::typeinfo,E::~E);
  }
  AlphaVectorPOMDP::BeliefBackup(&local_88,&this->super_AlphaVectorPOMDP,b,a,G);
  AlphaVectorPlanning::QFunctionsToValueFunction(&local_a0,Q);
  AlphaVectorBG::BeliefBackup
            (&local_60,(AlphaVectorBG *)&(this->super_AlphaVectorPOMDP).field_0x8,b,a,G,&local_a0,
             BGIP_SOLVER_EXHAUSTIVE);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_a0);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a0,
             (ulong)((long)local_88._m_values.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_88._m_values.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff,&local_38,
             &local_a1);
  uVar5 = (ulong)((long)local_88._m_values.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_88._m_values.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar4 = (int)uVar5;
  if (iVar4 != 0) {
    lVar3 = *(long *)(*(long *)&(this->super_AlphaVectorPOMDP).field_0x40 + (ulong)a * 0x18);
    uVar6 = (long)local_88._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar9 = (long)local_60._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_60._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    uVar8 = 0;
    do {
      uVar7 = uVar6;
      if ((uVar6 <= uVar8) || (uVar7 = uVar9, uVar9 <= uVar8)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                   ,uVar7);
      }
      dVar1 = *(double *)(lVar3 + uVar8 * 8);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_88._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8];
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           (1.0 - dVar1) *
           local_60._m_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar8];
      auVar2 = vfmadd231sd_fma(auVar11,auVar10,auVar2);
      *(long *)(&(local_a0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                  super__Vector_impl_data._M_start)->_m_action + uVar8 * 2) = auVar2._0_8_;
      uVar8 = uVar8 + 1;
    } while (iVar4 != (int)uVar8);
  }
  AlphaVector::AlphaVector(__return_storage_ptr__,uVar5 & 0xffffffff);
  AlphaVector::SetValues
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)&local_a0);
  __return_storage_ptr__->_m_action = a;
  AlphaVector::SetBetaI(__return_storage_ptr__,local_60._m_betaI);
  if (local_a0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  AlphaVector::~AlphaVector(&local_60);
  AlphaVector::~AlphaVector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

AlphaVector
AlphaVectorWeighted::BeliefBackup(const JointBeliefInterface &b,
                                  Index a,
                                  const GaoVectorSet &G,
                                  const QFunctionsDiscrete &Q) const
{
    if(!_m_initialized)
        throw(E("AlphaVectorWeighted::BeliefBackup not initialized"));

    AlphaVector alphaPOMDP=AlphaVectorPOMDP::BeliefBackup(b,a,G);
    AlphaVector alphaBG=
        AlphaVectorBG::BeliefBackup(b,a,G,
                                    QFunctionsToValueFunction(Q),
                                    BGIP_SOLVER_EXHAUSTIVE);

    vector<double> valuesWeighted(alphaPOMDP.GetNrValues(),0);
    double w;
#if 0
    for(unsigned i=0;i!=alphaPOMDP.GetNrValues();++i)
        valuesWeighted[i]=(_m_weights[i] * alphaPOMDP.GetValue(i) +
                           (1-_m_weights[i]) * alphaBG.GetValue(i));
#else
    for(unsigned i=0;i!=alphaPOMDP.GetNrValues();++i)
    {
        w=_m_weightsBackProjected[a][i];
        valuesWeighted[i]=(w * alphaPOMDP.GetValue(i) +
                           (1-w) * alphaBG.GetValue(i));
    }
#endif
    AlphaVector alphaWeighted(alphaPOMDP.GetNrValues());
    alphaWeighted.SetValues(valuesWeighted);
    alphaWeighted.SetAction(a);
    alphaWeighted.SetBetaI(alphaBG.GetBetaI());

#if DEBUG_AlphaVectorWeighted
    double Vpomdp=BeliefValue::GetValue(b,alphaPOMDP),
        Vbg=BeliefValue::GetValue(b,alphaBG),
        Vweighted=BeliefValue::GetValue(b,alphaWeighted);

    cout << "AlphaVectorWeighted::BeliefBackup"
         << " for a " << a
#if 0
         << alphaWeighted.GetAction() << " bI "
         << alphaWeighted.GetBetaI() << " Vpomdp " << Vpomdp
         << " Vbg " << Vbg << " Vweighted " << Vweighted
#endif
         << " b " << b.SoftPrint() << " alpha " << alphaWeighted.SoftPrint()
         << endl;
#endif

    return(alphaWeighted);
}